

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::SInt64SizeWithPackedTagSize
                 (RepeatedField<long> *value,size_t tag_size,CachedSize *cached_size)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  const_reference plVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  int index;
  
  bVar2 = RepeatedField<long>::empty(value);
  if (bVar2) {
    if (cached_size->atom_ != 0) {
      cached_size->atom_ = 0;
    }
    sVar5 = 0;
  }
  else {
    iVar3 = RepeatedField<long>::size(value);
    lVar7 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (index = 0; iVar3 != index; index = index + 1) {
      plVar4 = RepeatedField<long>::Get(value,index);
      sVar5 = SInt64Size(*plVar4);
      lVar7 = lVar7 + sVar5;
    }
    CachedSize::SetNonZero(cached_size,(int)lVar7);
    uVar6 = (long)(int)lVar7 | 1;
    lVar1 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar5 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + tag_size + lVar7;
  }
  return sVar5;
}

Assistant:

size_t WireFormatLite::SInt64SizeWithPackedTagSize(
    const RepeatedField<int64_t>& value, size_t tag_size,
    const internal::CachedSize& cached_size) {
  if (value.empty()) {
    cached_size.Set(0);
    return 0;
  }
  size_t res;
  PROTOBUF_ALWAYS_INLINE_CALL res = SInt64Size(value);
  cached_size.SetNonZero(ToCachedSize(res));
  return tag_size + res + Int32Size(static_cast<int32_t>(res));
}